

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidget::insertAction(QWidget *this,QAction *before,QAction *action)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  QAction *pQVar4;
  long lVar5;
  long in_RCX;
  long lVar6;
  QPodArrayOps<QObject*> *this_00;
  long in_FS_OFFSET;
  QWidget *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (action == (QAction *)0x0) {
    insertAction();
    goto LAB_002ffa29;
  }
  lVar3 = *(long *)&this->field_0x8;
  if (*(long *)(lVar3 + 0x230) == 0) {
LAB_002ff92e:
    in_RCX = -1;
  }
  else {
    lVar5 = -8;
    do {
      lVar6 = *(long *)(lVar3 + 0x230) * -8 + lVar5;
      if (lVar6 == -8) goto LAB_002ff928;
      in_RCX = lVar5 + 8;
      plVar2 = (long *)(*(long *)(lVar3 + 0x228) + 8 + lVar5);
      lVar5 = in_RCX;
    } while ((QAction *)*plVar2 != action);
    in_RCX = in_RCX >> 3;
LAB_002ff928:
    if (lVar6 == -8) goto LAB_002ff92e;
  }
  if (in_RCX != -1) {
    removeAction(this,action);
  }
  lVar5 = *(long *)(lVar3 + 0x230);
  if (lVar5 == 0) {
LAB_002ff994:
    in_RCX = -1;
  }
  else {
    lVar6 = -8;
    do {
      lVar1 = lVar5 * -8 + lVar6;
      if (lVar1 == -8) goto LAB_002ff98e;
      in_RCX = lVar6 + 8;
      plVar2 = (long *)(*(long *)(lVar3 + 0x228) + 8 + lVar6);
      lVar6 = in_RCX;
    } while ((QAction *)*plVar2 != before);
    in_RCX = in_RCX >> 3;
LAB_002ff98e:
    if (lVar1 == -8) goto LAB_002ff994;
  }
  pQVar4 = (QAction *)0x0;
  if (-1 < (int)in_RCX) {
    lVar5 = in_RCX;
    pQVar4 = before;
  }
  local_58 = (QWidget *)action;
  QtPrivate::QPodArrayOps<QAction*>::emplace<QAction*&>
            ((QPodArrayOps<QAction*> *)(lVar3 + 0x220),(long)(int)lVar5,(QAction **)&local_58);
  QList<QAction_*>::begin((QList<QAction_*> *)(lVar3 + 0x220));
  this_00 = (QPodArrayOps<QObject*> *)(*(long *)(action + 8) + 0x140);
  local_58 = this;
  QtPrivate::QPodArrayOps<QObject*>::emplace<QObject*&>
            (this_00,*(qsizetype *)(*(long *)(action + 8) + 0x150),(QObject **)&local_58);
  QList<QObject_*>::end((QList<QObject_*> *)this_00);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QActionEvent::QActionEvent((QActionEvent *)&local_58,0x72,action,pQVar4);
  QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)&local_58);
  QActionEvent::~QActionEvent((QActionEvent *)&local_58);
LAB_002ffa29:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::insertAction(QAction *before, QAction *action)
{
    if (Q_UNLIKELY(!action)) {
        qWarning("QWidget::insertAction: Attempt to insert null action");
        return;
    }

    Q_D(QWidget);
    if (d->actions.contains(action))
        removeAction(action);

    int pos = d->actions.indexOf(before);
    if (pos < 0) {
        before = nullptr;
        pos = d->actions.size();
    }
    d->actions.insert(pos, action);

    QActionPrivate *apriv = action->d_func();
    apriv->associatedObjects.append(this);

    QActionEvent e(QEvent::ActionAdded, action, before);
    QCoreApplication::sendEvent(this, &e);
}